

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_test.cpp
# Opt level: O3

void test_function<Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3>
               (Function_lemniscate_revolution_in_R3 *fun)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  bool bVar4;
  VectorXd res_seed;
  VectorXd seed;
  Function_lemniscate_revolution_in_R3 local_f8;
  shared_count sStack_d8;
  Function_lemniscate_revolution_in_R3 local_d0;
  Function_lemniscate_revolution_in_R3 local_b0;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3::seed(&local_d0);
  Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3::seed(&local_b0);
  Gudhi::coxeter_triangulation::Function_lemniscate_revolution_in_R3::operator()
            (&local_f8,(VectorXd *)fun);
  free((void *)local_b0.a_);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x32);
  local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1]._0_1_ = local_d0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] == 1.48219693752374e-323;
  local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  pdVar2 = (double *)
           ((long)local_d0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 8);
  local_d0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 6.04039223883404e-318;
  local_d0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 6.04057010246654e-318;
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0]._0_1_ = 0;
  local_b0.a_ = (double)&PTR__lazy_ostream_00149d28;
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (double)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_58 = "";
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)pdVar2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x33);
  local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1]._0_1_ = local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] == 4.94065645841247e-324;
  local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_d0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 6.040575043123e-318;
  local_d0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 6.04077266938134e-318;
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0]._0_1_ = 0;
  local_b0.a_ = (double)&PTR__lazy_ostream_00149d28;
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (double)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_88 = "";
  local_b0.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)pdVar2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  bVar4 = true;
  lVar3 = 0;
  while( true ) {
    if (!bVar4) {
      free((void *)local_f8.a_);
      free((void *)local_d0.a_);
      return;
    }
    if ((long)local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] <= lVar3) break;
    lVar1 = lVar3 * 8;
    lVar3 = 1;
    bVar4 = false;
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*(double *)((long)local_f8.a_ + lVar1),0.0,1e-10);
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void test_function(const Function& fun) {
  Eigen::VectorXd seed = fun.seed();
  Eigen::VectorXd res_seed = fun(fun.seed());
  BOOST_CHECK(seed.size() == (long int)fun.amb_d());
  BOOST_CHECK(res_seed.size() == (long int)fun.cod_d());
  for (std::size_t i = 0; i < fun.cod_d(); i++) GUDHI_TEST_FLOAT_EQUALITY_CHECK(res_seed(i), 0., 1e-10);
}